

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generator_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::cpp::anon_unknown_0::CppGeneratorTest_StringTypeCordNotForExtension_Test
::TestBody(CppGeneratorTest_StringTypeCordNotForExtension_Test *this)

{
  string_view local_50;
  string_view local_40;
  string_view local_30;
  string_view local_20;
  CppGeneratorTest_StringTypeCordNotForExtension_Test *local_10;
  CppGeneratorTest_StringTypeCordNotForExtension_Test *this_local;
  
  local_10 = this;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_20,"foo.proto");
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_30,
             "\n    edition = \"2024\";\n    import \"google/protobuf/cpp_features.proto\";\n\n    message Foo {\n      extensions 1 to max;\n    }\n    extend Foo {\n      bytes bar = 1 [features.(pb.cpp).string_type = CORD];\n    }\n  "
            );
  CommandLineInterfaceTester::CreateTempFile((CommandLineInterfaceTester *)this,local_20,local_30);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_40,
             "protocol_compiler --proto_path=$tmpdir --cpp_out=$tmpdir --experimental_editions foo.proto"
            );
  CommandLineInterfaceTester::RunProtoc((CommandLineInterfaceTester *)this,local_40);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_50,
             "Extension bar specifies CORD string type which is not supported for extensions");
  CommandLineInterfaceTester::ExpectErrorSubstring((CommandLineInterfaceTester *)this,local_50);
  return;
}

Assistant:

TEST_F(CppGeneratorTest, StringTypeCordNotForExtension) {
  CreateTempFile("foo.proto", R"schema(
    edition = "2024";
    import "google/protobuf/cpp_features.proto";

    message Foo {
      extensions 1 to max;
    }
    extend Foo {
      bytes bar = 1 [features.(pb.cpp).string_type = CORD];
    }
  )schema");

  RunProtoc(
      "protocol_compiler --proto_path=$tmpdir --cpp_out=$tmpdir "
      "--experimental_editions foo.proto");

  ExpectErrorSubstring(
      "Extension bar specifies CORD string type which is not supported for "
      "extensions");
}